

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O2

ssize_t __thiscall VCXProjectWriter::write(VCXProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  XmlOutput *pXVar1;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  xml_output xStack_1e8;
  xml_output local_1b0;
  QArrayDataPointer<char16_t> local_178;
  xml_output local_160;
  QArrayDataPointer<QString> local_128;
  QArrayDataPointer<char16_t> local_110;
  xml_output local_f8;
  QArrayDataPointer<char16_t> local_c0;
  xml_output local_a8;
  xml_output local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  tag(&local_70,(QString *)((long)__buf + 0x40));
  pXVar1 = XmlOutput::operator<<((XmlOutput *)CONCAT44(in_register_00000034,__fd),&local_70);
  QString::QString((QString *)&local_c0,"Command");
  tag(&local_a8,(QString *)&local_c0);
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_a8);
  local_128.d = *(Data **)((long)__buf + 8);
  local_128.ptr = *(QString **)((long)__buf + 0x10);
  local_128.size = *(qsizetype *)((long)__buf + 0x18);
  if (local_128.d != (Data *)0x0) {
    LOCK();
    ((local_128.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  commandLinesForOutput((QString *)&local_110,(QStringList *)&local_128);
  valueTag(&local_f8,(QString *)&local_110);
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_f8);
  QString::QString((QString *)&local_178,"Message");
  tag(&local_160,(QString *)&local_178);
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_160);
  valueTag(&local_1b0,(QString *)((long)__buf + 0x20));
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_1b0);
  closetag(&xStack_1e8,(QString *)((long)__buf + 0x40));
  XmlOutput::operator<<(pXVar1,&xStack_1e8);
  XmlOutput::xml_output::~xml_output(&xStack_1e8);
  XmlOutput::xml_output::~xml_output(&local_1b0);
  XmlOutput::xml_output::~xml_output(&local_160);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
  XmlOutput::xml_output::~xml_output(&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_110);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_128);
  XmlOutput::xml_output::~xml_output(&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
  XmlOutput::xml_output::~xml_output(&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCXProjectWriter::write(XmlOutput &xml, const VCEventTool &tool)
{
    xml
        << tag(tool.EventName)
            << tag(_Command) << valueTag(commandLinesForOutput(tool.CommandLine))
            << tag(_Message) << valueTag(tool.Description)
        << closetag(tool.EventName);
}